

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_char>::tryExpand
          (HoleSet<unsigned_char> *this,uchar oldLgSize,uint oldOffset,uint expansionFactor)

{
  bool bVar1;
  size_t sVar2;
  Fault local_68;
  Fault f;
  uchar *local_58;
  undefined1 local_50 [8];
  DebugComparison<unsigned_char_&,_unsigned_long> _kjCondition;
  uint expansionFactor_local;
  uint oldOffset_local;
  uchar oldLgSize_local;
  HoleSet<unsigned_char> *this_local;
  
  if (expansionFactor == 0) {
    this_local._7_1_ = true;
  }
  else {
    _kjCondition._36_4_ = expansionFactor;
    expansionFactor_local._3_1_ = oldLgSize;
    _oldOffset_local = this;
    sVar2 = kj::size<unsigned_char,6ul>(this->holes);
    if (oldLgSize == sVar2) {
      this_local._7_1_ = false;
    }
    else {
      local_58 = (uchar *)kj::_::DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                     (uchar *)((long)&expansionFactor_local + 3));
      f.exception = (Exception *)kj::size<unsigned_char,6ul>(this->holes);
      kj::_::DebugExpression<unsigned_char&>::operator<
                ((DebugComparison<unsigned_char_&,_unsigned_long> *)local_50,
                 (DebugExpression<unsigned_char&> *)&local_58,(unsigned_long *)&f);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_50);
      if (!bVar1) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char&,unsigned_long>&>
                  (&local_68,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x89,FAILED,"oldLgSize < kj::size(holes)","_kjCondition,",
                   (DebugComparison<unsigned_char_&,_unsigned_long> *)local_50);
        kj::_::Debug::Fault::fatal(&local_68);
      }
      if ((uint)this->holes[expansionFactor_local._3_1_] == oldOffset + 1) {
        bVar1 = tryExpand(this,expansionFactor_local._3_1_ + 1,oldOffset >> 1,
                          _kjCondition._36_4_ - 1);
        if (bVar1) {
          this->holes[expansionFactor_local._3_1_] = '\0';
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool tryExpand(UIntType oldLgSize, uint oldOffset, uint expansionFactor) {
      // Try to expand the value at the given location by combining it with subsequent holes, so
      // as to expand the location to be 2^expansionFactor times the size that it started as.
      // (In other words, the new lgSize is oldLgSize + expansionFactor.)

      if (expansionFactor == 0) {
        // No expansion requested.
        return true;
      }
      if (oldLgSize == kj::size(holes)) {
        // Old value is already a full word. Further expansion is impossible.
        return false;
      }
      KJ_ASSERT(oldLgSize < kj::size(holes));
      if (holes[oldLgSize] != oldOffset + 1) {
        // The space immediately after the location is not a hole.
        return false;
      }

      // We can expand the location by one factor by combining it with a hole.  Try to further
      // expand from there to the number of factors requested.
      if (tryExpand(oldLgSize + 1, oldOffset >> 1, expansionFactor - 1)) {
        // Success.  Consume the hole.
        holes[oldLgSize] = 0;
        return true;
      } else {
        return false;
      }
    }